

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_85be2f::VariableValueHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  
  if (value == (Value *)0x0) {
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (!bVar1) {
      bVar1 = std::
              function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::VariableStringHelper_abi_cxx11_,out,value,state
                          );
      return bVar1;
    }
    Json::Value::asBool(value);
    std::__cxx11::string::assign((char *)out);
  }
  return true;
}

Assistant:

bool VariableValueHelper(std::string& out, const Json::Value* value,
                         cmJSONState* state)
{
  if (!value) {
    out.clear();
    return true;
  }

  if (value->isBool()) {
    out = value->asBool() ? "TRUE" : "FALSE";
    return true;
  }

  return VariableStringHelper(out, value, state);
}